

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qstringbuilder.h
# Opt level: O1

QString * __thiscall
QStringBuilder<ProString_&,_ProString_&>::convertTo<QString>
          (QString *__return_storage_ptr__,QStringBuilder<ProString_&,_ProString_&> *this)

{
  int iVar1;
  int iVar2;
  ProString *pPVar3;
  char16_t *pcVar4;
  CutResult CVar5;
  char16_t *pcVar6;
  long lVar7;
  char16_t *__dest;
  long in_FS_OFFSET;
  long local_48;
  long local_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  if (((this->a->m_string).d.ptr == (char16_t *)0x0) &&
     ((this->b->m_string).d.ptr == (char16_t *)0x0)) {
    if (*(long *)(in_FS_OFFSET + 0x28) != local_38) goto LAB_001866c7;
    (__return_storage_ptr__->d).d = (Data *)0x0;
    (__return_storage_ptr__->d).ptr = (char16_t *)0x0;
    (__return_storage_ptr__->d).size = 0;
  }
  else {
    iVar1 = this->a->m_length;
    iVar2 = this->b->m_length;
    (__return_storage_ptr__->d).size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
    (__return_storage_ptr__->d).d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
    (__return_storage_ptr__->d).ptr = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
    QString::QString(__return_storage_ptr__,(long)iVar2 + (long)iVar1,Uninitialized);
    __dest = (__return_storage_ptr__->d).ptr;
    pPVar3 = this->a;
    lVar7 = (long)pPVar3->m_length;
    if (lVar7 != 0) {
      pcVar4 = (pPVar3->m_string).d.ptr;
      local_40 = (long)pPVar3->m_offset;
      local_48 = lVar7;
      CVar5 = QtPrivate::QContainerImplHelper::mid((pPVar3->m_string).d.size,&local_40,&local_48);
      pcVar6 = (char16_t *)0x0;
      if (CVar5 != Null) {
        pcVar6 = pcVar4 + local_40;
      }
      memcpy(__dest,pcVar6,lVar7 * 2);
      __dest = __dest + lVar7;
    }
    pPVar3 = this->b;
    lVar7 = (long)pPVar3->m_length;
    if (lVar7 != 0) {
      pcVar4 = (pPVar3->m_string).d.ptr;
      local_40 = (long)pPVar3->m_offset;
      local_48 = lVar7;
      CVar5 = QtPrivate::QContainerImplHelper::mid((pPVar3->m_string).d.size,&local_40,&local_48);
      pcVar6 = (char16_t *)0x0;
      if (CVar5 != Null) {
        pcVar6 = pcVar4 + local_40;
      }
      memcpy(__dest,pcVar6,lVar7 * 2);
    }
    if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
LAB_001866c7:
      __stack_chk_fail();
    }
  }
  return __return_storage_ptr__;
}

Assistant:

T convertTo() const
    {
        if (isNull()) {
            // appending two null strings must give back a null string,
            // so we're special casing this one out, QTBUG-114206
            return T();
        }

        const qsizetype len = Concatenable::size(*this);
        T s(len, Qt::Uninitialized);

        // Using data_ptr() here (private API) so we can bypass the
        // isDetached() and the replacement of a null pointer with _empty in
        // both QString and QByteArray's data() and constData(). The result is
        // the same if len != 0.
        auto d = reinterpret_cast<typename T::iterator>(s.data_ptr().data());
        const auto start = d;
        Concatenable::appendTo(*this, d);

        if constexpr (Concatenable::ExactSize) {
            Q_UNUSED(start)
        } else {
            if (len != d - start) {
                // this resize is necessary since we allocate a bit too much
                // when dealing with variable sized 8-bit encodings
                s.resize(d - start);
            }
        }
        return s;
    }